

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_entry.cpp
# Opt level: O0

char * astcenc_get_error_string(astcenc_error status)

{
  astcenc_error status_local;
  char *local_8;
  
  switch(status) {
  case ASTCENC_SUCCESS:
    local_8 = "ASTCENC_SUCCESS";
    break;
  case ASTCENC_ERR_OUT_OF_MEM:
    local_8 = "ASTCENC_ERR_OUT_OF_MEM";
    break;
  case ASTCENC_ERR_BAD_CPU_FLOAT:
    local_8 = "ASTCENC_ERR_BAD_CPU_FLOAT";
    break;
  case ASTCENC_ERR_BAD_PARAM:
    local_8 = "ASTCENC_ERR_BAD_PARAM";
    break;
  case ASTCENC_ERR_BAD_BLOCK_SIZE:
    local_8 = "ASTCENC_ERR_BAD_BLOCK_SIZE";
    break;
  case ASTCENC_ERR_BAD_PROFILE:
    local_8 = "ASTCENC_ERR_BAD_PROFILE";
    break;
  case ASTCENC_ERR_BAD_QUALITY:
    local_8 = "ASTCENC_ERR_BAD_QUALITY";
    break;
  case ASTCENC_ERR_BAD_SWIZZLE:
    local_8 = "ASTCENC_ERR_BAD_SWIZZLE";
    break;
  case ASTCENC_ERR_BAD_FLAGS:
    local_8 = "ASTCENC_ERR_BAD_FLAGS";
    break;
  case ASTCENC_ERR_BAD_CONTEXT:
    local_8 = "ASTCENC_ERR_BAD_CONTEXT";
    break;
  case ASTCENC_ERR_NOT_IMPLEMENTED:
    local_8 = "ASTCENC_ERR_NOT_IMPLEMENTED";
    break;
  case ASTCENC_ERR_BAD_DECODE_MODE:
    local_8 = "ASTCENC_ERR_BAD_DECODE_MODE";
    break;
  default:
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char* astcenc_get_error_string(
	astcenc_error status
) {
	// Values in this enum are from an external user, so not guaranteed to be
	// bounded to the enum values
	switch (static_cast<int>(status))
	{
	case ASTCENC_SUCCESS:
		return "ASTCENC_SUCCESS";
	case ASTCENC_ERR_OUT_OF_MEM:
		return "ASTCENC_ERR_OUT_OF_MEM";
	case ASTCENC_ERR_BAD_CPU_FLOAT:
		return "ASTCENC_ERR_BAD_CPU_FLOAT";
	case ASTCENC_ERR_BAD_PARAM:
		return "ASTCENC_ERR_BAD_PARAM";
	case ASTCENC_ERR_BAD_BLOCK_SIZE:
		return "ASTCENC_ERR_BAD_BLOCK_SIZE";
	case ASTCENC_ERR_BAD_PROFILE:
		return "ASTCENC_ERR_BAD_PROFILE";
	case ASTCENC_ERR_BAD_QUALITY:
		return "ASTCENC_ERR_BAD_QUALITY";
	case ASTCENC_ERR_BAD_FLAGS:
		return "ASTCENC_ERR_BAD_FLAGS";
	case ASTCENC_ERR_BAD_SWIZZLE:
		return "ASTCENC_ERR_BAD_SWIZZLE";
	case ASTCENC_ERR_BAD_CONTEXT:
		return "ASTCENC_ERR_BAD_CONTEXT";
	case ASTCENC_ERR_NOT_IMPLEMENTED:
		return "ASTCENC_ERR_NOT_IMPLEMENTED";
	case ASTCENC_ERR_BAD_DECODE_MODE:
		return "ASTCENC_ERR_BAD_DECODE_MODE";
#if defined(ASTCENC_DIAGNOSTICS)
	case ASTCENC_ERR_DTRACE_FAILURE:
		return "ASTCENC_ERR_DTRACE_FAILURE";
#endif
	default:
		return nullptr;
	}
}